

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O1

QString * __thiscall
QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[35]>,_const_char_*const_&>::
convertTo<QString>(QString *__return_storage_ptr__,
                  QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[35]>,_const_char_*const_&>
                  *this)

{
  QChar *__dest;
  QString *pQVar1;
  char *pcVar2;
  long lVar3;
  size_t sVar4;
  long lVar5;
  char16_t *__src;
  long lVar6;
  long lVar7;
  long in_FS_OFFSET;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  iterator d;
  QChar *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar6 = (((this->a).a)->d).size;
  if (*this->b == (char *)0x0) {
    sVar4 = 0;
  }
  else {
    sVar4 = strlen(*this->b);
  }
  lVar7 = lVar6 + sVar4 + 0x22;
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::QString(__return_storage_ptr__,lVar7,Uninitialized);
  __dest = (QChar *)(__return_storage_ptr__->d).ptr;
  pQVar1 = (this->a).a;
  lVar6 = (pQVar1->d).size;
  local_38 = __dest;
  if (lVar6 != 0) {
    __src = (pQVar1->d).ptr;
    if (__src == (char16_t *)0x0) {
      __src = (char16_t *)&QString::_empty;
    }
    memcpy(__dest,__src,lVar6 * 2);
  }
  local_38 = local_38 + lVar6;
  QVar8.m_data = *(this->a).b;
  QVar8.m_size = 0x22;
  QAbstractConcatenable::convertFromUtf8(QVar8,&local_38);
  pcVar2 = *this->b;
  if (pcVar2 == (char *)0x0) {
    lVar6 = 0;
  }
  else {
    lVar5 = -1;
    do {
      lVar6 = lVar5 + 1;
      lVar3 = lVar5 + 1;
      lVar5 = lVar6;
    } while (pcVar2[lVar3] != '\0');
  }
  QVar9.m_data = pcVar2;
  QVar9.m_size = lVar6;
  QAbstractConcatenable::convertFromUtf8(QVar9,&local_38);
  if (lVar7 != (long)local_38 - (long)__dest >> 1) {
    QString::resize((longlong)__return_storage_ptr__);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }